

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O0

void __thiscall QCborStreamWriter::append(QCborStreamWriter *this,qfloat16 f)

{
  long lVar1;
  undefined2 in_SI;
  _func_CborError_CborEncoder_ptr_void_ptr *in_RDI;
  long in_FS_OFFSET;
  undefined6 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>::
  operator->((unique_ptr<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_> *
             )0x8de62b);
  QCborStreamWriterPrivate::executeAppend<void_const*>
            ((QCborStreamWriterPrivate *)CONCAT26(in_SI,in_stack_fffffffffffffff0),in_RDI,
             (void *)0x8de63f);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCborStreamWriter::append(qfloat16 f)
{
    d->executeAppend(cbor_encode_half_float, static_cast<const void *>(&f));
}